

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int array_container_index_equalorlarger(array_container_t *arr,uint16_t x)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int32_t candidate;
  
  iVar2 = arr->cardinality;
  if (iVar2 < 1) {
    iVar4 = 0;
  }
  else {
    iVar5 = iVar2 + -1;
    iVar4 = 0;
    do {
      uVar3 = (uint)(iVar5 + iVar4) >> 1;
      uVar1 = *(ushort *)((long)arr->array + (ulong)(iVar5 + iVar4 & 0xfffffffe));
      if (uVar1 < x) {
        iVar4 = uVar3 + 1;
      }
      else {
        if (uVar1 <= x) {
          return uVar3;
        }
        iVar5 = uVar3 - 1;
      }
    } while (iVar4 <= iVar5);
  }
  iVar5 = -1;
  if (iVar4 < iVar2) {
    iVar5 = iVar4;
  }
  return iVar5;
}

Assistant:

inline int array_container_index_equalorlarger(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx;
    } else {
        int32_t candidate = - idx - 1;
        if(candidate < arr->cardinality) return candidate;
        return -1;
    }
}